

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O2

QVariant * __thiscall
AbstractStringSerialiserPrivate::loadVariant
          (QVariant *__return_storage_ptr__,AbstractStringSerialiserPrivate *this,int type,
          QString *val)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  QTime QVar4;
  QDate QVar5;
  longlong lVar6;
  ulonglong uVar7;
  uint uVar8;
  QArrayDataPointer<char> *this_00;
  float fVar9;
  QArrayDataPointer<char> local_40;
  
  if ((val->d).size == 0) {
switchD_00120fac_caseD_0:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    return __return_storage_ptr__;
  }
  iVar2 = (int)this;
  switch(type) {
  case 0:
    goto switchD_00120fac_caseD_0;
  case 1:
    iVar2 = QString::toInt(val,(bool *)0x0,10);
    ::QVariant::QVariant(__return_storage_ptr__,iVar2 == 1);
    break;
  case 2:
  case 0x20:
    uVar8 = QString::toInt(val,(bool *)0x0,10);
    goto LAB_001211df;
  case 3:
  case 0x23:
    uVar3 = QString::toUInt(val,(bool *)0x0,10);
    ::QVariant::QVariant(__return_storage_ptr__,uVar3);
    break;
  case 4:
    lVar6 = QString::toLongLong((bool *)val,0);
    ::QVariant::QVariant(__return_storage_ptr__,lVar6);
    break;
  case 5:
    uVar7 = QString::toULongLong((bool *)val,0);
    ::QVariant::QVariant(__return_storage_ptr__,uVar7);
    break;
  case 6:
    dVar1 = (double)QString::toDouble((bool *)val);
    ::QVariant::QVariant(__return_storage_ptr__,dVar1);
    break;
  case 7:
    ::QVariant::QVariant(__return_storage_ptr__,(QChar)*(val->d).ptr);
    break;
  case 8:
  case 9:
  case 0xb:
  case 0xd:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x27:
switchD_00120fac_caseD_8:
    stringToVariant(__return_storage_ptr__,this,val);
    break;
  case 10:
    ::QVariant::QVariant(__return_storage_ptr__,val);
    break;
  case 0xc:
    QString::toLatin1_helper((QString *)&stack0xffffffffffffffd8);
    QByteArray::fromBase64(&local_40,(QString *)&stack0xffffffffffffffd8,0);
    ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)&local_40);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&stack0xffffffffffffffd8)
    ;
    break;
  case 0xe:
    QVar5 = QDate::fromString(val,ISODate);
    ::QVariant::QVariant(__return_storage_ptr__,QVar5);
    break;
  case 0xf:
    QVar4 = QTime::fromString(val,ISODate);
    ::QVariant::QVariant(__return_storage_ptr__,QVar4);
    break;
  case 0x10:
    QDateTime::fromString((QDateTime *)&local_40,val,ISODate);
    ::QVariant::QVariant(__return_storage_ptr__,(QDateTime *)&local_40);
    QDateTime::~QDateTime((QDateTime *)&local_40);
    break;
  case 0x21:
    iVar2 = QString::toInt(val,(bool *)0x0,10);
    uVar8 = (uint)(short)iVar2;
    goto LAB_001211df;
  case 0x22:
  case 0x28:
    iVar2 = QString::toInt(val,(bool *)0x0,10);
    uVar8 = (uint)(char)iVar2;
    goto LAB_001211df;
  case 0x24:
    uVar3 = QString::toUInt(val,(bool *)0x0,10);
    uVar8 = uVar3 & 0xffff;
    goto LAB_001211df;
  case 0x25:
    uVar3 = QString::toUInt(val,(bool *)0x0,10);
    uVar8 = uVar3 & 0xff;
LAB_001211df:
    ::QVariant::QVariant(__return_storage_ptr__,uVar8);
    break;
  case 0x26:
    fVar9 = (float)QString::toFloat((bool *)val);
    ::QVariant::QVariant(__return_storage_ptr__,fVar9);
    break;
  default:
    if (type == 0x1001) {
      loadImageVariant((AbstractStringSerialiserPrivate *)&stack0xffffffffffffffd8,iVar2,val);
      QPixmap::fromImageInPlace
                (&local_40,(AbstractStringSerialiserPrivate *)&stack0xffffffffffffffd8,0);
      QPixmap::operator_cast_to_QVariant(__return_storage_ptr__,(QPixmap *)&local_40);
      QPixmap::~QPixmap((QPixmap *)&local_40);
LAB_00121243:
      this_00 = (QArrayDataPointer<char> *)&stack0xffffffffffffffd8;
    }
    else {
      if (type != 0x1006) {
        if (type != 0x1009) goto switchD_00120fac_caseD_8;
        loadImageVariant((AbstractStringSerialiserPrivate *)&stack0xffffffffffffffd8,iVar2,val);
        QBitmap::fromImage(&local_40,(AbstractStringSerialiserPrivate *)&stack0xffffffffffffffd8,0);
        QBitmap::operator_cast_to_QVariant(__return_storage_ptr__,(QBitmap *)&local_40);
        QPixmap::~QPixmap((QPixmap *)&local_40);
        goto LAB_00121243;
      }
      loadImageVariant((AbstractStringSerialiserPrivate *)&local_40,iVar2,val);
      QImage::operator_cast_to_QVariant(__return_storage_ptr__,(QImage *)&local_40);
      this_00 = &local_40;
    }
    QImage::~QImage((QImage *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant AbstractStringSerialiserPrivate::loadVariant(int type, const QString &val) const
{
    if (val.isEmpty())
        return QVariant();
    switch (type) {
    case QMetaType::UnknownType:
        Q_ASSERT_X(false, "ModelSerialisation::loadVariant", "Trying to load unregistered type.");
        return QVariant();
    case QMetaType::Bool:
        return val.toInt() == 1;
    case QMetaType::Long:
    case QMetaType::Int:
        return val.toInt();
    case QMetaType::ULong:
    case QMetaType::UInt:
        return val.toUInt();
    case QMetaType::LongLong:
        return val.toLongLong();
    case QMetaType::ULongLong:
        return val.toULongLong();
    case QMetaType::Double:
        return val.toDouble();
    case QMetaType::Short:
        return static_cast<short>(val.toInt());
    case QMetaType::SChar:
    case QMetaType::Char:
        return static_cast<char>(val.toInt());
    case QMetaType::UShort:
        return static_cast<unsigned short>(val.toUInt());
    case QMetaType::UChar:
        return static_cast<unsigned char>(val.toUInt());
    case QMetaType::Float:
        return val.toFloat();
    case QMetaType::QChar:
        return val.at(0);
    case QMetaType::QString:
        return val;
    case QMetaType::QByteArray:
        return QByteArray::fromBase64(val.toLatin1());
    case QMetaType::QDate:
        return QDate::fromString(val, Qt::ISODate);
    case QMetaType::QTime:
        return QTime::fromString(val, Qt::ISODate);
    case QMetaType::QDateTime:
        return QDateTime::fromString(val, Qt::ISODate);
#ifdef QT_GUI_LIB
    case QMetaType::QImage:
        return loadImageVariant(type, val);
    case QMetaType::QPixmap:
        return QPixmap::fromImage(loadImageVariant(type, val));
    case QMetaType::QBitmap:
        return QBitmap::fromImage(loadImageVariant(type, val));
#endif
    default:
        return stringToVariant(val);
    }
}